

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

string * __thiscall wasm::Struct::toString_abi_cxx11_(string *__return_storage_ptr__,Struct *this)

{
  ostringstream local_1a8 [8];
  ostringstream ss;
  _Vector_base<wasm::Field,_std::allocator<wasm::Field>_> local_30;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&local_30,&this->fields);
  wasm::operator<<((ostream *)local_1a8,(Struct *)&local_30);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base(&local_30);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Struct::toString() const { return genericToString(*this); }